

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodePrintAllStats(void *cvode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  long lVar1;
  int line;
  int error_code;
  long in_R8;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x65d;
  }
  else {
    if (fmt < 2) {
      sunfprintf_real(outfile,fmt,1,"Current time",*(sunrealtype *)((long)cvode_mem + 0x168));
      sunfprintf_long(outfile,fmt,0x123338,*(char **)((long)cvode_mem + 0x358),in_R8);
      sunfprintf_long(outfile,fmt,0x122b13,*(char **)((long)cvode_mem + 0x380),in_R8);
      sunfprintf_long(outfile,fmt,0x122b24,*(char **)((long)cvode_mem + 0x368),in_R8);
      sunfprintf_real(outfile,fmt,0,"Initial step size",*(sunrealtype *)((long)cvode_mem + 0x438));
      sunfprintf_real(outfile,fmt,0,"Last step size",*(sunrealtype *)((long)cvode_mem + 0x440));
      sunfprintf_real(outfile,fmt,0,"Current step size",*(sunrealtype *)((long)cvode_mem + 0x150));
      sunfprintf_long(outfile,fmt,0x122b66,(char *)(long)*(int *)((long)cvode_mem + 0x428),in_R8);
      sunfprintf_long(outfile,fmt,0x122b78,(char *)(long)*(int *)((long)cvode_mem + 0x128),in_R8);
      sunfprintf_long(outfile,fmt,0x122b8d,*(char **)((long)cvode_mem + 0x558),in_R8);
      sunfprintf_long(outfile,fmt,0x122bea,*(char **)((long)cvode_mem + 0x360),in_R8);
      sunfprintf_long(outfile,fmt,0x122ba9,*(char **)((long)cvode_mem + 0x370),in_R8);
      sunfprintf_long(outfile,fmt,0x122bb3,*(char **)((long)cvode_mem + 0x378),in_R8);
      if (0 < *(long *)((long)cvode_mem + 0x358)) {
        sunfprintf_real(outfile,fmt,0,"NLS iters per step",
                        (double)*(long *)((long)cvode_mem + 0x370) /
                        (double)*(long *)((long)cvode_mem + 0x358));
      }
      sunfprintf_long(outfile,fmt,0x122bd0,*(char **)((long)cvode_mem + 0x388),in_R8);
      lVar1 = *(long *)((long)cvode_mem + 0x410);
      if (lVar1 != 0) {
        sunfprintf_long(outfile,fmt,0x122bda,*(char **)(lVar1 + 0x88),in_R8);
        sunfprintf_long(outfile,fmt,0x122be7,*(char **)(lVar1 + 0x90),in_R8);
        sunfprintf_long(outfile,fmt,0x122bf7,*(char **)(lVar1 + 0xa0),in_R8);
        sunfprintf_long(outfile,fmt,0x122c08,*(char **)(lVar1 + 0xb0),in_R8);
        sunfprintf_long(outfile,fmt,0x122baa,*(char **)(lVar1 + 0xa8),in_R8);
        sunfprintf_long(outfile,fmt,0x122bb4,*(char **)(lVar1 + 0xb8),in_R8);
        sunfprintf_long(outfile,fmt,0x122c14,*(char **)(lVar1 + 0xc0),in_R8);
        sunfprintf_long(outfile,fmt,0x122c25,*(char **)(lVar1 + 200),in_R8);
        if (0 < *(long *)((long)cvode_mem + 0x370)) {
          sunfprintf_real(outfile,fmt,0,"LS iters per NLS iter",
                          (double)*(long *)(lVar1 + 0xa8) /
                          (double)*(long *)((long)cvode_mem + 0x370));
          sunfprintf_real(outfile,fmt,0,"Jac evals per NLS iter",
                          (double)*(long *)(lVar1 + 0x88) /
                          (double)*(long *)((long)cvode_mem + 0x370));
          sunfprintf_real(outfile,fmt,0,"Prec evals per NLS iter",
                          (double)*(long *)(lVar1 + 0xa0) /
                          (double)*(long *)((long)cvode_mem + 0x370));
        }
      }
      sunfprintf_long(outfile,fmt,0x122c7a,*(char **)((long)cvode_mem + 0x5c8),in_R8);
      lVar1 = *(long *)((long)cvode_mem + 0x5e0);
      if (lVar1 == 0) {
        return 0;
      }
      sunfprintf_long(outfile,fmt,0x122c88,*(char **)(lVar1 + 0x40),in_R8);
      sunfprintf_long(outfile,fmt,0x122c9c,*(char **)(lVar1 + 0x48),in_R8);
      return 0;
    }
    msgfmt = "Invalid formatting option.";
    error_code = -0x16;
    line = 0x665;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodePrintAllStats",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodePrintAllStats(void* cvode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeProjMem cvproj_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (fmt != SUN_OUTPUTFORMAT_TABLE && fmt != SUN_OUTPUTFORMAT_CSV)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid formatting option.");
    return (CV_ILL_INPUT);
  }

  /* step and method stats */
  sunfprintf_real(outfile, fmt, SUNTRUE, "Current time", cv_mem->cv_tn);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Steps", cv_mem->cv_nst);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Error test fails", cv_mem->cv_netf);
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS step fails", cv_mem->cv_ncfn);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Initial step size", cv_mem->cv_h0u);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Last step size", cv_mem->cv_hu);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Current step size", cv_mem->cv_next_h);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Last method order", cv_mem->cv_qu);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Current method order",
                  cv_mem->cv_next_q);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Stab. lim. order reductions",
                  cv_mem->cv_nor);
  /* function evaluations */
  sunfprintf_long(outfile, fmt, SUNFALSE, "RHS fn evals", cv_mem->cv_nfe);
  /* nonlinear solver stats */
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS iters", cv_mem->cv_nni);
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS fails", cv_mem->cv_nnf);
  if (cv_mem->cv_nst > 0)
  {
    sunfprintf_real(outfile, fmt, SUNFALSE, "NLS iters per step",
                    (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
  }
  sunfprintf_long(outfile, fmt, SUNFALSE, "LS setups", cv_mem->cv_nsetups);
  if (cv_mem->cv_lmem)
  {
    cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac fn evals", cvls_mem->nje);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS RHS fn evals", cvls_mem->nfeDQ);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Prec setup evals", cvls_mem->npe);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Prec solves", cvls_mem->nps);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS iters", cvls_mem->nli);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS fails", cvls_mem->ncfl);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac-times setups",
                    cvls_mem->njtsetup);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac-times evals", cvls_mem->njtimes);
    if (cv_mem->cv_nni > 0)
    {
      sunfprintf_real(outfile, fmt, SUNFALSE, "LS iters per NLS iter",
                      (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
      sunfprintf_real(outfile, fmt, SUNFALSE, "Jac evals per NLS iter",
                      (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
      sunfprintf_real(outfile, fmt, SUNFALSE, "Prec evals per NLS iter",
                      (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
    }
  }
  /* rootfinding stats */
  sunfprintf_long(outfile, fmt, SUNFALSE, "Root fn evals", cv_mem->cv_nge);
  /* projection stats */
  if (cv_mem->proj_mem)
  {
    cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Projection fn evals",
                    cvproj_mem->nproj);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Projection fails",
                    cvproj_mem->npfails);
  }

  return (CV_SUCCESS);
}